

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O1

TupleDataChunkPart * __thiscall
duckdb::TupleDataAllocator::BuildChunkPart
          (TupleDataChunkPart *__return_storage_ptr__,TupleDataAllocator *this,
          TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,idx_t append_offset,
          idx_t append_count,TupleDataChunk *chunk)

{
  idx_t *piVar1;
  pointer pTVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  BlockHandle *pBVar6;
  idx_t iVar7;
  __int_type _Var8;
  data_ptr_t pdVar9;
  BufferHandle *pBVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  unsigned_long size;
  ulong local_60;
  idx_t local_58;
  data_ptr_t local_50;
  TupleDataPinState *local_48;
  pointer local_40;
  ulong local_38;
  
  local_58 = append_offset;
  local_48 = pin_state;
  TupleDataChunkPart::TupleDataChunkPart
            (__return_storage_ptr__,
             (chunk->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
             super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
             super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
             super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl);
  iVar3 = (*this->buffer_manager->_vptr_BufferManager[0xf])();
  local_60 = CONCAT44(extraout_var,iVar3);
  pTVar2 = (this->row_blocks).
           super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((((this->row_blocks).
        super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
        super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
        super__Vector_impl_data._M_start == pTVar2) ||
      (pTVar2[-1].capacity - pTVar2[-1].size < this->layout->row_width)) &&
     (::std::vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>>::
      emplace_back<duckdb::BufferManager&,unsigned_long_const&>
                ((vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>> *)
                 &this->row_blocks,this->buffer_manager,&local_60),
     (this->partition_index).index != 0xffffffffffffffff)) {
    pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       (&(this->row_blocks).
                         super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                         .
                         super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].handle);
    iVar7 = optional_idx::GetIndex(&this->partition_index);
    if (iVar7 == 0) {
      _Var8 = 0;
    }
    else {
      uVar11 = iVar7 >> 1 | iVar7;
      uVar11 = uVar11 >> 2 | uVar11;
      uVar11 = uVar11 >> 4 | uVar11;
      uVar11 = uVar11 >> 8 | uVar11;
      uVar11 = uVar11 >> 0x10 | uVar11;
      _Var8 = *(long *)(&DAT_01e418f0 + ((uVar11 >> 0x20 | uVar11) * 0x3f79d71b4cb0a89 >> 0x3a) * 8)
              + 1;
    }
    LOCK();
    (pBVar6->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = _Var8;
    UNLOCK();
  }
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    (((long)(this->row_blocks).
                            super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                            .
                            super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->row_blocks).
                            super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                            .
                            super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  __return_storage_ptr__->row_block_index = uVar4;
  pTVar2 = (this->row_blocks).
           super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = pTVar2 + uVar4;
  uVar5 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(pTVar2[uVar4].size);
  __return_storage_ptr__->row_block_offset = uVar5;
  uVar11 = (pTVar2[uVar4].capacity - pTVar2[uVar4].size) / this->layout->row_width;
  if (uVar11 < append_count) {
    append_count = uVar11;
  }
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(append_count);
  __return_storage_ptr__->count = uVar4;
  if (this->layout->all_constant != false) goto LAB_01609409;
  local_50 = (chunk_state->heap_sizes).data;
  if (uVar4 == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    uVar11 = 0;
    do {
      uVar12 = uVar12 + *(long *)(local_50 + uVar11 * 8 + local_58 * 8);
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  if (uVar12 == 0) {
LAB_0160938e:
    __return_storage_ptr__->heap_block_index = 0xffffffff;
    __return_storage_ptr__->heap_block_offset = 0xffffffff;
    __return_storage_ptr__->total_heap_size = 0;
    pdVar9 = (data_ptr_t)0x0;
  }
  else {
    pTVar2 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar11 = local_60;
    if ((this->heap_blocks).
        super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
        super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
        super__Vector_impl_data._M_start != pTVar2) {
      uVar11 = pTVar2[-1].capacity - pTVar2[-1].size;
    }
    uVar13 = *(ulong *)(local_50 + local_58 * 8);
    if (*(ulong *)(local_50 + local_58 * 8) < uVar11) {
      uVar13 = uVar11;
    }
    if (uVar13 < uVar12) {
      __return_storage_ptr__->total_heap_size = 0;
      if (__return_storage_ptr__->count != 0) {
        uVar12 = 0;
        do {
          uVar11 = (ulong)__return_storage_ptr__->total_heap_size +
                   *(long *)(local_50 + uVar12 * 8 + local_58 * 8);
          if (uVar13 < uVar11) {
            uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar12);
            __return_storage_ptr__->count = uVar4;
            break;
          }
          __return_storage_ptr__->total_heap_size = (uint32_t)uVar11;
          uVar12 = uVar12 + 1;
        } while (uVar12 < __return_storage_ptr__->count);
      }
    }
    else {
      uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar12);
      __return_storage_ptr__->total_heap_size = uVar4;
    }
    if (__return_storage_ptr__->total_heap_size == 0) goto LAB_0160938e;
    pTVar2 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((this->heap_blocks).
         super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
         super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl
         .super__Vector_impl_data._M_start == pTVar2) ||
       (pTVar2[-1].capacity - pTVar2[-1].size < *(ulong *)(local_50 + local_58 * 8))) {
      local_38 = *(ulong *)(local_50 + local_58 * 8);
      if (*(ulong *)(local_50 + local_58 * 8) < local_60) {
        local_38 = local_60;
      }
      ::std::vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>>::
      emplace_back<duckdb::BufferManager&,unsigned_long_const&>
                ((vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>> *)
                 &this->heap_blocks,this->buffer_manager,&local_38);
      if ((this->partition_index).index != 0xffffffffffffffff) {
        pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                           (&(this->heap_blocks).
                             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                             .
                             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].handle);
        iVar7 = optional_idx::GetIndex(&this->partition_index);
        if (iVar7 == 0) {
          _Var8 = 0;
        }
        else {
          uVar11 = iVar7 >> 1 | iVar7;
          uVar11 = uVar11 >> 2 | uVar11;
          uVar11 = uVar11 >> 4 | uVar11;
          uVar11 = uVar11 >> 8 | uVar11;
          uVar11 = uVar11 >> 0x10 | uVar11;
          _Var8 = *(long *)(&DAT_01e418f0 +
                           ((uVar11 >> 0x20 | uVar11) * 0x3f79d71b4cb0a89 >> 0x3a) * 8) + 1;
        }
        LOCK();
        (pBVar6->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = _Var8;
        UNLOCK();
      }
    }
    uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                      (((long)(this->heap_blocks).
                              super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                              .
                              super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->heap_blocks).
                              super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                              .
                              super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    __return_storage_ptr__->heap_block_index = uVar4;
    pTVar2 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(pTVar2[uVar4].size);
    __return_storage_ptr__->heap_block_offset = uVar5;
    piVar1 = &pTVar2[uVar4].size;
    *piVar1 = *piVar1 + (ulong)__return_storage_ptr__->total_heap_size;
    pBVar10 = PinHeapBlock(this,local_48,__return_storage_ptr__);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar10->node);
    pdVar9 = ((pBVar10->node).ptr)->buffer;
  }
  __return_storage_ptr__->base_heap_ptr = pdVar9;
LAB_01609409:
  local_40->size = local_40->size + (ulong)__return_storage_ptr__->count * this->layout->row_width;
  return __return_storage_ptr__;
}

Assistant:

TupleDataChunkPart TupleDataAllocator::BuildChunkPart(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                                      const idx_t append_offset, const idx_t append_count,
                                                      TupleDataChunk &chunk) {
	D_ASSERT(append_count != 0);
	TupleDataChunkPart result(*chunk.lock);
	const auto block_size = buffer_manager.GetBlockSize();

	// Allocate row block (if needed)
	if (row_blocks.empty() || row_blocks.back().RemainingCapacity() < layout.GetRowWidth()) {
		row_blocks.emplace_back(buffer_manager, block_size);
		if (partition_index.IsValid()) { // Set the eviction queue index logarithmically using RadixBits
			row_blocks.back().handle->SetEvictionQueueIndex(RadixPartitioning::RadixBits(partition_index.GetIndex()));
		}
	}
	result.row_block_index = NumericCast<uint32_t>(row_blocks.size() - 1);
	auto &row_block = row_blocks[result.row_block_index];
	result.row_block_offset = NumericCast<uint32_t>(row_block.size);

	// Set count (might be reduced later when checking heap space)
	result.count = NumericCast<uint32_t>(MinValue(row_block.RemainingCapacity(layout.GetRowWidth()), append_count));
	if (!layout.AllConstant()) {
		const auto heap_sizes = FlatVector::GetData<idx_t>(chunk_state.heap_sizes);

		// Compute total heap size first
		idx_t total_heap_size = 0;
		for (idx_t i = 0; i < result.count; i++) {
			const auto &heap_size = heap_sizes[append_offset + i];
			total_heap_size += heap_size;
		}

		if (total_heap_size == 0) {
			result.SetHeapEmpty();
		} else {
			const auto heap_remaining = MaxValue<idx_t>(
			    heap_blocks.empty() ? block_size : heap_blocks.back().RemainingCapacity(), heap_sizes[append_offset]);

			if (total_heap_size <= heap_remaining) {
				// Everything fits
				result.total_heap_size = NumericCast<uint32_t>(total_heap_size);
			} else {
				// Not everything fits - determine how many we can read next
				result.total_heap_size = 0;
				for (idx_t i = 0; i < result.count; i++) {
					const auto &heap_size = heap_sizes[append_offset + i];
					if (result.total_heap_size + heap_size > heap_remaining) {
						result.count = NumericCast<uint32_t>(i);
						break;
					}
					result.total_heap_size += heap_size;
				}
			}

			if (result.total_heap_size == 0) {
				result.SetHeapEmpty();
			} else {
				// Allocate heap block (if needed)
				if (heap_blocks.empty() || heap_blocks.back().RemainingCapacity() < heap_sizes[append_offset]) {
					const auto size = MaxValue<idx_t>(block_size, heap_sizes[append_offset]);
					heap_blocks.emplace_back(buffer_manager, size);
					if (partition_index.IsValid()) { // Set the eviction queue index logarithmically using RadixBits
						heap_blocks.back().handle->SetEvictionQueueIndex(
						    RadixPartitioning::RadixBits(partition_index.GetIndex()));
					}
				}
				result.heap_block_index = NumericCast<uint32_t>(heap_blocks.size() - 1);
				auto &heap_block = heap_blocks[result.heap_block_index];
				result.heap_block_offset = NumericCast<uint32_t>(heap_block.size);

				// Mark this portion of the heap block as filled and set the pointer
				heap_block.size += result.total_heap_size;
				result.base_heap_ptr = GetBaseHeapPointer(pin_state, result);
			}
		}
	}
	D_ASSERT(result.count != 0 && result.count <= STANDARD_VECTOR_SIZE);

	// Mark this portion of the row block as filled
	row_block.size += result.count * layout.GetRowWidth();

	return result;
}